

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  long in_RSI;
  int in_EDI;
  ValidationErrorHandler errorHandler;
  ValidationErrorHandler *in_stack_00000478;
  char *in_stack_00000480;
  ValidationErrorHandler *in_stack_ffffffffffffffa0;
  ValidationErrorHandler local_20;
  long local_10;
  int local_4;
  
  local_4 = 0;
  if (in_EDI < 2) {
    printHelpText();
    local_4 = 0;
  }
  else {
    local_10 = in_RSI;
    ValidationErrorHandler::ValidationErrorHandler(in_stack_ffffffffffffffa0);
    parse(in_stack_00000480,in_stack_00000478);
    bVar1 = ValidationErrorHandler::getFileNotFound(&local_20);
    if (bVar1) {
      printHelpText();
      local_4 = -2;
    }
    else {
      bVar1 = ValidationErrorHandler::hasHandledSaxParserError(&local_20);
      if (bVar1) {
        local_4 = -1;
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"\"");
        poVar2 = std::operator<<(poVar2,*(char **)(local_10 + 8));
        std::operator<<(poVar2,"\" is valid against the COLLADA ");
        if (version == COLLADA_14) {
          std::operator<<((ostream *)&std::cout,"1.4.1");
        }
        else if (version == COLLADA_15) {
          std::operator<<((ostream *)&std::cout,"1.5.0");
        }
        poVar2 = std::operator<<((ostream *)&std::cout," schema.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        local_4 = 0;
      }
    }
    ValidationErrorHandler::~ValidationErrorHandler((ValidationErrorHandler *)0x7733de);
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) 
{
	if ( argc > 1 ) 
	{
		ValidationErrorHandler errorHandler;

		parse( argv[1], errorHandler);

		if ( errorHandler.getFileNotFound() )
		{
			printHelpText();
			return -2;
		} 
		
		if ( errorHandler.hasHandledSaxParserError() )
		{
			return -1;
		}
		else
		{
			std::cout << "\"" << argv[1]<< "\" is valid against the COLLADA ";
			switch ( version )
			{
			case COLLADASaxFWL::COLLADA_14:
				std::cout << "1.4.1";
				break;
			case COLLADASaxFWL::COLLADA_15:
				std::cout << "1.5.0";
				break;
			}
			std::cout << " schema." << std::endl;
			return 0;
		}
	}
	else
	{
		printHelpText();
		return 0;
	}

}